

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O2

bool RigidBodyDynamics::Math::SpatialMatrixCompareEpsilon
               (SpatialMatrix *matrix_a,SpatialMatrix *matrix_b,Scalar epsilon)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ostream *poVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = 0;
  pdVar3 = (double *)matrix_b;
  pdVar5 = (double *)matrix_a;
  do {
    if (uVar7 == 6) {
LAB_001f84d6:
      return 5 < uVar7;
    }
    lVar6 = 0;
    while (lVar6 + 0x30 != 0x150) {
      pdVar1 = (double *)((long)pdVar5 + lVar6);
      pdVar2 = (double *)((long)pdVar3 + lVar6);
      lVar6 = lVar6 + 0x30;
      if (epsilon <= ABS(*pdVar1 - *pdVar2)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Expected:");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                                          matrix_a);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"but was");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)
                                          matrix_b);
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_001f84d6;
      }
    }
    uVar7 = uVar7 + 1;
    pdVar5 = pdVar5 + 1;
    pdVar3 = pdVar3 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI bool SpatialMatrixCompareEpsilon (
    const SpatialMatrix &matrix_a, 
    const SpatialMatrix &matrix_b, 
    Scalar epsilon) {
  assert (epsilon >= Scalar(0.));
  unsigned int i, j;

  for (i = 0; i < 6; i++) {
    for (j = 0; j < 6; j++) {
      if (Scalar(fabs(matrix_a(i,j) - matrix_b(i,j))) >= Scalar(epsilon)) {
        std::cerr << "Expected:" 
          << std::endl << matrix_a << std::endl
          << "but was" << std::endl 
          << matrix_b << std::endl;
        return false;
      }
    }
  }

  return true;
}